

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O0

bool duckdb_re2::ChildArgsChanged(Regexp *re,Regexp **child_args)

{
  int iVar1;
  Regexp **ppRVar2;
  long in_RSI;
  Regexp *in_RDI;
  Regexp *newsub_1;
  int i_1;
  Regexp *newsub;
  Regexp *sub;
  int i;
  int local_34;
  int local_1c;
  
  local_1c = 0;
  while( true ) {
    iVar1 = Regexp::nsub(in_RDI);
    if (iVar1 <= local_1c) {
      for (local_34 = 0; iVar1 = Regexp::nsub(in_RDI), local_34 < iVar1; local_34 = local_34 + 1) {
        Regexp::Decref(sub);
      }
      return false;
    }
    ppRVar2 = Regexp::sub(in_RDI);
    if (*(Regexp **)(in_RSI + (long)local_1c * 8) != ppRVar2[local_1c]) break;
    local_1c = local_1c + 1;
  }
  return true;
}

Assistant:

static bool ChildArgsChanged(Regexp* re, Regexp** child_args) {
  for (int i = 0; i < re->nsub(); i++) {
    Regexp* sub = re->sub()[i];
    Regexp* newsub = child_args[i];
    if (newsub != sub)
      return true;
  }
  for (int i = 0; i < re->nsub(); i++) {
    Regexp* newsub = child_args[i];
    newsub->Decref();
  }
  return false;
}